

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void update_vertex_color_shader(float t,float *vertex_colors)

{
  long lVar1;
  long lVar2;
  double dVar3;
  
  lVar2 = 0;
  do {
    dVar3 = sin((double)((float)(int)lVar2 + t));
    lVar1 = lVar2 + 1;
    vertex_colors[lVar2] = (float)((dVar3 + 1.0) * 0.5 * 0.5 + 0.5);
    dVar3 = sin((double)((float)(int)lVar1 + t));
    vertex_colors[lVar2 + 1] = (float)((dVar3 + 1.0) * 0.5 * 0.5 + 0.5);
    dVar3 = sin((double)((float)((int)lVar1 + 1) + t));
    vertex_colors[lVar2 + 2] = (float)((dVar3 + 1.0) * 0.5 * 0.5 + 0.5);
    vertex_colors[lVar2 + 3] = 1.0;
    lVar2 = lVar1;
  } while (lVar1 != 6);
  return;
}

Assistant:

void update_vertex_color_shader(float t, float vertex_colors[24])
{
    for(int i = 0; i < 6; ++i)
    {
        vertex_colors[i] = 0.5f + 0.5f*(1 + sin(t + (i)))/2;
        vertex_colors[i+1] = 0.5f + 0.5f*(1 + sin(t + (i+1)))/2;
        vertex_colors[i+2] = 0.5f + 0.5f*(1 + sin(t + (i+2)))/2;
        vertex_colors[i+3] = 1.0f;
    }
}